

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefiledeps.cpp
# Opt level: O2

void __thiscall
QMakeSourceFileInfo::addSourceFiles
          (QMakeSourceFileInfo *this,ProStringList *l,uchar seek,SourceFileType type)

{
  int i;
  ulong uVar1;
  long lVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = 0;
  for (uVar1 = 0; uVar1 < (ulong)(l->super_QList<ProString>).d.size; uVar1 = uVar1 + 1) {
    ProString::toQString
              ((QString *)&local_50,
               (ProString *)((long)&(((l->super_QList<ProString>).d.ptr)->m_string).d.d + lVar2));
    addSourceFile(this,(QString *)&local_50,seek,type);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    lVar2 = lVar2 + 0x30;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMakeSourceFileInfo::addSourceFiles(const ProStringList &l, uchar seek,
                                         QMakeSourceFileInfo::SourceFileType type)
{
    for(int i=0; i<l.size(); ++i)
        addSourceFile(l.at(i).toQString(), seek, type);
}